

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputRequiredFilesCommand.cxx
# Opt level: O2

void __thiscall
cmOutputRequiredFilesCommand::ListDependencies
          (cmOutputRequiredFilesCommand *this,cmDependInformation *info,FILE *fout,
          set<const_cmDependInformation_*,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
          *visited)

{
  bool bVar1;
  iterator iVar2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_node_base *p_Var6;
  cmDependInformation *d;
  FILE *local_98;
  _Base_ptr local_90;
  _Rb_tree_node_base *local_88;
  cmOutputRequiredFilesCommand *local_80;
  cmDependInformation *info_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string tmp;
  
  local_98 = (FILE *)fout;
  local_80 = this;
  info_local = info;
  std::
  _Rb_tree<cmDependInformation_const*,cmDependInformation_const*,std::_Identity<cmDependInformation_const*>,std::less<cmDependInformation_const*>,std::allocator<cmDependInformation_const*>>
  ::_M_insert_unique<cmDependInformation_const*const&>
            ((_Rb_tree<cmDependInformation_const*,cmDependInformation_const*,std::_Identity<cmDependInformation_const*>,std::less<cmDependInformation_const*>,std::allocator<cmDependInformation_const*>>
              *)visited,&info_local);
  p_Var6 = &(info_local->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header;
  p_Var5 = &(visited->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_90 = p_Var5;
  local_88 = p_Var6;
  for (p_Var4 = (info_local->DependencySet)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var4 != p_Var6; p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    d = *(cmDependInformation **)(p_Var4 + 1);
    iVar2 = std::
            _Rb_tree<const_cmDependInformation_*,_const_cmDependInformation_*,_std::_Identity<const_cmDependInformation_*>,_std::less<const_cmDependInformation_*>,_std::allocator<const_cmDependInformation_*>_>
            ::find(&visited->_M_t,&d);
    if (iVar2._M_node == p_Var5) {
      if ((info_local->FullPath)._M_string_length != 0) {
        std::__cxx11::string::string((string *)&tmp,(string *)&d->FullPath);
        lVar3 = std::__cxx11::string::rfind((char)&tmp,0x2e);
        if (lVar3 != -1) {
          std::__cxx11::string::substr((ulong)&local_70,(ulong)&tmp);
          bVar1 = std::operator!=(&local_70,".h");
          std::__cxx11::string::~string((string *)&local_70);
          if (bVar1) {
            std::__cxx11::string::substr((ulong)&local_70,(ulong)&tmp);
            std::__cxx11::string::operator=((string *)&tmp,(string *)&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            fprintf(local_98,"%s\n",(d->FullPath)._M_dataplus._M_p);
          }
        }
        std::__cxx11::string::~string((string *)&tmp);
        p_Var5 = local_90;
        p_Var6 = local_88;
      }
      ListDependencies(local_80,d,(FILE *)local_98,visited);
    }
  }
  return;
}

Assistant:

void cmOutputRequiredFilesCommand::ListDependencies(
  cmDependInformation const* info, FILE* fout,
  std::set<cmDependInformation const*>* visited)
{
  // add info to the visited set
  visited->insert(info);
  // now recurse with info's dependencies
  for (cmDependInformation* d : info->DependencySet) {
    if (visited->find(d) == visited->end()) {
      if (!info->FullPath.empty()) {
        std::string tmp = d->FullPath;
        std::string::size_type pos = tmp.rfind('.');
        if (pos != std::string::npos && (tmp.substr(pos) != ".h")) {
          tmp = tmp.substr(0, pos);
          fprintf(fout, "%s\n", d->FullPath.c_str());
        }
      }
      this->ListDependencies(d, fout, visited);
    }
  }
}